

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

char * strnstr(char *s1,char *s2,size_t len)

{
  int iVar1;
  size_t __n;
  size_t l2;
  size_t l1;
  size_t len_local;
  char *s2_local;
  char *s1_local;
  
  __n = strlen(s2);
  l2 = len;
  s2_local = s1;
  s1_local = s1;
  if (__n != 0) {
    while (__n <= l2) {
      l2 = l2 - 1;
      iVar1 = memcmp(s2_local,s2,__n);
      if (iVar1 == 0) {
        return s2_local;
      }
      s2_local = s2_local + 1;
    }
    s1_local = (char *)0x0;
  }
  return s1_local;
}

Assistant:

char* strnstr(char* s1, const char* s2, const size_t len)
{
    size_t l1 = len;
    const size_t l2 = strlen(s2);
    if (!l2)
        return s1;
    while (l1 >= l2)
    {
        l1--;
        if (!memcmp(s1, s2, l2))
            return s1;
        s1++;
    }
    return nullptr;
}